

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-error.c
# Opt level: O3

int run_test_pipe_connect_bad_name(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int iVar3;
  uv_pipe_t *puVar4;
  uv_connect_t req;
  uv_pipe_t client;
  uv_connect_t uStack_2f0;
  uv_pipe_t uStack_290;
  uv_loop_t *puStack_188;
  code *pcStack_180;
  uv_connect_t local_170;
  uv_pipe_t local_110;
  
  pcStack_180 = (code *)0x16284d;
  puVar2 = uv_default_loop();
  puVar4 = &local_110;
  pcStack_180 = (code *)0x16285c;
  iVar1 = uv_pipe_init(puVar2,puVar4,0);
  iVar3 = (int)puVar4;
  if (iVar1 == 0) {
    pcStack_180 = (code *)0x16287d;
    uv_pipe_connect(&local_170,&local_110,"/path/to/unix/socket/that/really/should/not/be/there",
                    connect_cb);
    pcStack_180 = (code *)0x162882;
    puVar2 = uv_default_loop();
    iVar3 = 0;
    pcStack_180 = (code *)0x16288c;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001628e2;
    if (connect_cb_called != 1) goto LAB_001628e7;
    pcStack_180 = (code *)0x1628a3;
    unaff_RBX = uv_default_loop();
    pcStack_180 = (code *)0x1628b7;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    pcStack_180 = (code *)0x1628c1;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_180 = (code *)0x1628c6;
    puVar2 = uv_default_loop();
    pcStack_180 = (code *)0x1628ce;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_180 = (code *)0x1628e2;
    run_test_pipe_connect_bad_name_cold_1();
LAB_001628e2:
    pcStack_180 = (code *)0x1628e7;
    run_test_pipe_connect_bad_name_cold_2();
LAB_001628e7:
    pcStack_180 = (code *)0x1628ec;
    run_test_pipe_connect_bad_name_cold_3();
  }
  pcStack_180 = connect_cb;
  run_test_pipe_connect_bad_name_cold_4();
  if (iVar3 == -2) {
    puStack_188 = (uv_loop_t *)0x162907;
    pcStack_180._0_4_ = extraout_EAX;
    uv_close((uv_handle_t *)puVar2->pending_queue[0],close_cb);
    connect_cb_called = connect_cb_called + 1;
    return (int)pcStack_180;
  }
  puStack_188 = (uv_loop_t *)run_test_pipe_connect_to_file;
  connect_cb_cold_1();
  puStack_188 = unaff_RBX;
  puVar2 = uv_default_loop();
  puVar4 = &uStack_290;
  iVar1 = uv_pipe_init(puVar2,puVar4,0);
  iVar3 = (int)puVar4;
  if (iVar1 == 0) {
    uv_pipe_connect(&uStack_2f0,&uStack_290,"test/fixtures/empty_file",connect_cb_file);
    puVar2 = uv_default_loop();
    iVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001629b6;
    if (connect_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      iVar3 = 0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001629c0;
    }
  }
  else {
    run_test_pipe_connect_to_file_cold_1();
LAB_001629b6:
    run_test_pipe_connect_to_file_cold_2();
  }
  run_test_pipe_connect_to_file_cold_3();
LAB_001629c0:
  run_test_pipe_connect_to_file_cold_4();
  if ((iVar3 == -0x6f) || (iVar3 == -0x58)) {
    uv_close((uv_handle_t *)puVar2->pending_queue[0],close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX_00;
  }
  connect_cb_file_cold_1();
  if (puVar2 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_01;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(pipe_connect_bad_name) {
  uv_pipe_t client;
  uv_connect_t req;
  int r;

  r = uv_pipe_init(uv_default_loop(), &client, 0);
  ASSERT(r == 0);
  uv_pipe_connect(&req, &client, BAD_PIPENAME, connect_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);
  ASSERT(connect_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}